

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  Vec_Int_t *p_00;
  int iVar1;
  int *piVar2;
  Hsh_IntObj_t *pHVar3;
  uint *__s2;
  int *piVar4;
  
  p_00 = p->vTable;
  iVar1 = Hsh_IntManHash(pData,p->nSize,p_00->nSize);
  piVar2 = Vec_IntEntryP(p_00,iVar1);
  do {
    piVar4 = piVar2;
    pHVar3 = Hsh_IntObj(p,*piVar4);
    if (pHVar3 == (Hsh_IntObj_t *)0x0) {
      if (*piVar4 == -1) {
        return piVar4;
      }
      __assert_fail("*pPlace == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                    ,0x9a,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
    }
    __s2 = Hsh_IntData(p,pHVar3->iData);
    iVar1 = bcmp(pData,__s2,(long)p->nSize << 2);
    piVar2 = &pHVar3->iNext;
  } while (iVar1 != 0);
  return piVar4;
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}